

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::writeOp<(moira::Core)1,(moira::Mode)2,4,64ull>(Moira *this,int n,u32 val)

{
  this->writeBuffer = (u16)(val >> 0x10);
  if ((uint)n < 8) {
    write<(moira::Core)1,(moira::AddrSpace)1,4,64ull>
              (this,*(u32 *)((long)&(this->reg).field_3 + (ulong)(uint)n * 4 + 0x20),val);
    return;
  }
  __assert_fail("n < 8",
                "/workspace/llm4binary/github/license_c_cmakelists/dirkwhoffmann[P]Moira/Moira/MoiraDataflow_cpp.h"
                ,0xb,
                "u32 moira::Moira::computeEA(u32) [C = moira::Core::C68010, M = moira::Mode::AI, S = 4, F = 0ULL]"
               );
}

Assistant:

void
Moira::writeOp(int n, u32 val)
{
    switch (M) {

        case Mode::DN: writeD<S>(n, val); break;
        case Mode::AN: writeA<S>(n, val); break;
        case Mode::IM: fatalError;

        default:

            writeBuffer = (S == Long) ? u16(val >> 16) : u16(val & 0xFFFF);

            // Compute effective address
            u32 ea = computeEA<C, M, S>(n);

            // Emulate -(An) register modification
            updateAnPD<M, S>(n);

            // Write to effective address
            writeM<C, M, S, F>(ea, val);

            // Emulate (An)+ register modification
            updateAnPI<M, S>(n);
    }
}